

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

CurrentAndNextIter __thiscall
cmConditionEvaluator::cmArgumentList::CurrentAndNextIter::advance
          (CurrentAndNextIter *this,base_t *args)

{
  _List_iterator<cmExpandedCommandArgument> _Var1;
  CurrentAndNextIter CVar2;
  
  _Var1 = std::next<std::_List_iterator<cmExpandedCommandArgument>>((this->current)._M_node,1);
  (this->current)._M_node = _Var1._M_node;
  _Var1 = std::next<std::_List_iterator<cmExpandedCommandArgument>>
                    (_Var1,(ulong)(_Var1._M_node != (_List_node_base *)args));
  (this->next)._M_node = _Var1._M_node;
  CVar2.next._M_node = _Var1._M_node;
  CVar2.current._M_node = (this->current)._M_node;
  return CVar2;
}

Assistant:

CurrentAndNextIter advance(base_t& args)
    {
      this->current = std::next(this->current);
      this->next =
        std::next(this->current,
                  static_cast<difference_type>(this->current != args.end()));
      return *this;
    }